

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O2

void __thiscall
duckdb::BitwiseOperation::
Operation<duckdb::string_t,duckdb::BitState<duckdb::string_t>,duckdb::BitStringOrOperation>
          (BitwiseOperation *this,BitState<duckdb::string_t> *state,string_t *input,
          AggregateUnaryInput *param_3)

{
  undefined8 uVar1;
  string_t input_00;
  string_t input_01;
  
  uVar1 = *(undefined8 *)&(state->value).value;
  if (*this != (BitwiseOperation)0x0) {
    input_00.value.pointer.ptr = (char *)param_3;
    input_00.value._0_8_ = uVar1;
    BitStringOrOperation::Execute<duckdb::string_t,duckdb::BitState<duckdb::string_t>>
              ((BitStringOrOperation *)this,*(BitState<duckdb::string_t> **)state,input_00);
    return;
  }
  input_01.value.pointer.ptr = (char *)param_3;
  input_01.value._0_8_ = uVar1;
  BitStringBitwiseOperation::Assign<duckdb::string_t,duckdb::BitState<duckdb::string_t>>
            ((BitStringBitwiseOperation *)this,*(BitState<duckdb::string_t> **)state,input_01);
  *this = (BitwiseOperation)0x1;
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &) {
		if (!state.is_set) {
			OP::template Assign<INPUT_TYPE>(state, input);
			state.is_set = true;
		} else {
			OP::template Execute<INPUT_TYPE>(state, input);
		}
	}